

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.cpp
# Opt level: O2

Uint32 Diligent::FindImmutableSampler
                 (ImmutableSamplerDesc *ImtblSamplers,Uint32 NumImtblSamplers,
                 SHADER_TYPE ShaderStages,char *ResourceName,char *SamplerSuffix)

{
  bool bVar1;
  char (*pacVar2) [95];
  ulong uVar3;
  char *ResourceName_local;
  string msg;
  
  pacVar2 = (char (*) [95])SamplerSuffix;
  ResourceName_local = ResourceName;
  if ((ResourceName == (char *)0x0) || (*ResourceName == '\0')) {
    FormatString<char[26],char[51]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ResourceName != nullptr && ResourceName[0] != \'\\0\'",
               (char (*) [51])ResourceName);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"FindImmutableSampler",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
               ,0x14e);
    std::__cxx11::string::~string((string *)&msg);
  }
  uVar3 = 0;
  while( true ) {
    if (NumImtblSamplers == uVar3) {
      return 0xffffffff;
    }
    if (((ImtblSamplers->ShaderStages & ShaderStages) != SHADER_TYPE_UNKNOWN) &&
       (bVar1 = StreqSuff(ResourceName,ImtblSamplers->SamplerOrTextureName,SamplerSuffix,false),
       bVar1)) break;
    uVar3 = uVar3 + 1;
    ImtblSamplers = ImtblSamplers + 1;
  }
  if ((ShaderStages & ~ImtblSamplers->ShaderStages) != SHADER_TYPE_UNKNOWN) {
    FormatString<char[63],char_const*,char[95]>
              (&msg,(Diligent *)"Immutable sampler uses only some of the stages that resource \'",
               (char (*) [63])&ResourceName_local,
               (char **)
               "\' is defined for. This error should\'ve been caught by ValidatePipelineResourceSignatureDesc()."
               ,pacVar2);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"FindImmutableSampler",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
               ,0x156);
    std::__cxx11::string::~string((string *)&msg);
  }
  return (Uint32)uVar3;
}

Assistant:

Uint32 FindImmutableSampler(const ImmutableSamplerDesc ImtblSamplers[],
                            Uint32                     NumImtblSamplers,
                            SHADER_TYPE                ShaderStages,
                            const char*                ResourceName,
                            const char*                SamplerSuffix)
{
    VERIFY_EXPR(ResourceName != nullptr && ResourceName[0] != '\0');
    for (Uint32 s = 0; s < NumImtblSamplers; ++s)
    {
        const ImmutableSamplerDesc& Sam = ImtblSamplers[s];
        if (((Sam.ShaderStages & ShaderStages) != 0) && StreqSuff(ResourceName, Sam.SamplerOrTextureName, SamplerSuffix))
        {
            VERIFY((Sam.ShaderStages & ShaderStages) == ShaderStages,
                   "Immutable sampler uses only some of the stages that resource '", ResourceName,
                   "' is defined for. This error should've been caught by ValidatePipelineResourceSignatureDesc().");
            return s;
        }
    }

    return InvalidImmutableSamplerIndex;
}